

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O2

pair<unsigned_long,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::InsertionState>
 __thiscall
robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>::
insertKeyPrepareEmptySpot<char_const&>
          (Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>> *this,
          char *key)

{
  int iVar1;
  uint uVar2;
  InfoType IVar3;
  bool bVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  uint uVar8;
  size_t insertion_idx;
  ulong uVar9;
  pair<unsigned_long,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::InsertionState>
  pVar10;
  InfoType info;
  size_t idx;
  int local_34;
  
  uVar9 = 0;
  uVar8 = 1;
  local_34 = 0;
  do {
    if (local_34 == 0x100) {
      insertion_idx = 0;
LAB_0012368f:
      pVar10._8_8_ = uVar9;
      pVar10.first = insertion_idx;
      return pVar10;
    }
    idx = 0;
    info = 0;
    keyToIdx<char_const&>(this,key,&idx,&info);
    Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::
    nextWhileLess((Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>
                   *)this,&info,&idx);
    lVar5 = *(long *)(this + 0x10);
    iVar1 = *(int *)(this + 0x30);
    pcVar6 = (char *)(idx * 0x10 + *(long *)(this + 8));
    for (; insertion_idx = idx, IVar3 = info, info == *(byte *)(lVar5 + idx); info = info + iVar1) {
      if (*key == *pcVar6) goto LAB_0012368c;
      idx = idx + 1;
      pcVar6 = pcVar6 + 0x10;
    }
    if (*(ulong *)(this + 0x18) < *(ulong *)(this + 0x28)) {
      if (0xff < iVar1 + info) {
        *(undefined8 *)(this + 0x28) = 0;
      }
      lVar7 = 0;
      uVar8 = iVar1 + info;
      for (; uVar2 = uVar8, *(char *)(lVar5 + idx) != '\0'; idx = idx + 1) {
        lVar7 = lVar7 + -1;
        uVar8 = uVar2 + iVar1;
        info = uVar2;
      }
      if (lVar7 != 0) {
        Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::shiftUp
                  ((Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>
                    *)this,idx,insertion_idx);
        lVar5 = *(long *)(this + 0x10);
      }
      *(char *)(lVar5 + insertion_idx) = (char)IVar3;
      *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
      uVar8 = idx == insertion_idx ^ 3;
LAB_0012368c:
      uVar9 = (ulong)uVar8;
      goto LAB_0012368f;
    }
    bVar4 = Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::
            increase_size((Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>
                           *)this);
    if (!bVar4) {
      insertion_idx = 0;
      uVar8 = 0;
      goto LAB_0012368c;
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

std::pair<size_t, InsertionState> insertKeyPrepareEmptySpot(OtherKey&& key) {
        for (int i = 0; i < 256; ++i) {
            size_t idx{};
            InfoType info{};
            keyToIdx(key, &idx, &info);
            nextWhileLess(&info, &idx);

            // while we potentially have a match
            while (info == mInfo[idx]) {
                if (WKeyEqual::operator()(key, mKeyVals[idx].getFirst())) {
                    // key already exists, do NOT insert.
                    // see http://en.cppreference.com/w/cpp/container/unordered_map/insert
                    return std::make_pair(idx, InsertionState::key_found);
                }
                next(&info, &idx);
            }

            // unlikely that this evaluates to true
            if (ROBIN_HOOD_UNLIKELY(mNumElements >= mMaxNumElementsAllowed)) {
                if (!increase_size()) {
                    return std::make_pair(size_t(0), InsertionState::overflow_error);
                }
                continue;
            }

            // key not found, so we are now exactly where we want to insert it.
            auto const insertion_idx = idx;
            auto const insertion_info = info;
            if (ROBIN_HOOD_UNLIKELY(insertion_info + mInfoInc > 0xFF)) {
                mMaxNumElementsAllowed = 0;
            }

            // find an empty spot
            while (0 != mInfo[idx]) {
                next(&info, &idx);
            }

            if (idx != insertion_idx) {
                shiftUp(idx, insertion_idx);
            }
            // put at empty spot
            mInfo[insertion_idx] = static_cast<uint8_t>(insertion_info);
            ++mNumElements;
            return std::make_pair(insertion_idx, idx == insertion_idx
                                                     ? InsertionState::new_node
                                                     : InsertionState::overwrite_node);
        }

        // enough attempts failed, so finally give up.
        return std::make_pair(size_t(0), InsertionState::overflow_error);
    }